

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O3

void __thiscall
QGridLayoutPrivate::distribute(QGridLayoutPrivate *this,QRect r,int hSpacing,int vSpacing)

{
  QGridBox *pQVar1;
  QLayoutStruct *pQVar2;
  QLayoutStruct *pQVar3;
  LayoutDirection LVar4;
  QWidget *this_00;
  byte bVar5;
  int pos;
  int pos_00;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  QList<QLayoutStruct> *chain;
  byte bVar11;
  int iVar12;
  long in_FS_OFFSET;
  uint local_48;
  uint local_44;
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar11 = this->field_0x194;
  this_00 = QLayout::parentWidget(*(QLayout **)&(this->super_QLayoutPrivate).field_0x8);
  if (this_00 != (QWidget *)0x0) {
    LVar4 = QWidget::layoutDirection(this_00);
    bVar11 = bVar11 ^ LVar4 == RightToLeft;
  }
  setupLayoutData(this,hSpacing,vSpacing);
  pos = this->leftMargin + r.x1.m_i.m_i;
  pos_00 = r.y1.m_i.m_i + this->topMargin;
  iVar12 = r.x2.m_i.m_i - this->rightMargin;
  iVar8 = r.y2.m_i.m_i - this->bottomMargin;
  iVar9 = iVar12 + 1;
  iVar10 = iVar9 - pos;
  qGeomCalc(&this->colData,0,this->cc,pos,iVar10,-1);
  if ((this->field_0x194 & 8) == 0) {
    chain = &this->rowData;
    qGeomCalc(chain,0,this->rr,pos_00,(iVar8 - pos_00) + 1,-1);
  }
  else {
    recalcHFW(this,iVar10);
    qGeomCalc(this->hfwData,0,this->rr,pos_00,(iVar8 - pos_00) + 1,-1);
    chain = this->hfwData;
  }
  iVar10 = (this->super_QLayoutPrivate).rect.y2.m_i;
  bVar5 = 1;
  if (iVar8 <= iVar10) {
    if (iVar8 == iVar10) {
      bVar5 = (this->super_QLayoutPrivate).rect.x2.m_i < iVar12 ^ bVar11;
    }
    else {
      bVar5 = 0;
    }
  }
  iVar10 = (int)(this->things).d.size;
  if (0 < iVar10) {
    iVar12 = 0;
    do {
      iVar10 = iVar10 + -1;
      iVar7 = iVar12;
      if ((bVar5 & 1) != 0) {
        iVar7 = iVar10;
      }
      pQVar1 = (this->things).d.ptr[iVar7];
      iVar7 = this->rr + -1;
      if (-1 < pQVar1->torow) {
        iVar7 = pQVar1->torow;
      }
      iVar6 = this->cc + -1;
      if (-1 < pQVar1->tocol) {
        iVar6 = pQVar1->tocol;
      }
      pQVar2 = (this->colData).d.ptr;
      iVar6 = pQVar2[iVar6].size + pQVar2[iVar6].pos;
      pQVar3 = (chain->d).ptr;
      iVar7 = pQVar3[iVar7].size + pQVar3[iVar7].pos;
      local_48 = (iVar9 + pos) - iVar6;
      if ((bVar11 & 1) == 0) {
        local_48 = pQVar2[pQVar1->col].pos;
      }
      local_44 = (iVar8 + pos_00 + 1) - iVar7;
      if ((this->field_0x194 & 2) == 0) {
        local_44 = pQVar3[pQVar1->row].pos;
      }
      local_40 = ~pQVar2[pQVar1->col].pos + iVar6 + local_48;
      local_3c = ~pQVar3[pQVar1->row].pos + iVar7 + local_44;
      (*pQVar1->item_->_vptr_QLayoutItem[6])(pQVar1->item_,&local_48);
      iVar12 = iVar12 + 1;
    } while (iVar10 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGridLayoutPrivate::distribute(QRect r, int hSpacing, int vSpacing)
{
    Q_Q(QGridLayout);
    bool visualHReversed = hReversed;
    QWidget *parent = q->parentWidget();
    if (parent && parent->isRightToLeft())
        visualHReversed = !visualHReversed;

    setupLayoutData(hSpacing, vSpacing);

    int left, top, right, bottom;
    effectiveMargins(&left, &top, &right, &bottom);
    r.adjust(+left, +top, -right, -bottom);

    qGeomCalc(colData, 0, cc, r.x(), r.width());
    QList<QLayoutStruct> *rDataPtr;
    if (has_hfw) {
        recalcHFW(r.width());
        qGeomCalc(*hfwData, 0, rr, r.y(), r.height());
        rDataPtr = hfwData;
    } else {
        qGeomCalc(rowData, 0, rr, r.y(), r.height());
        rDataPtr = &rowData;
    }
    QList<QLayoutStruct> &rData = *rDataPtr;
    int i;

    bool reverse = ((r.bottom() > rect.bottom()) || (r.bottom() == rect.bottom()
                                                     && ((r.right() > rect.right()) != visualHReversed)));
    int n = things.size();
    for (i = 0; i < n; ++i) {
        QGridBox *box = things.at(reverse ? n-i-1 : i);
        int r2 = box->toRow(rr);
        int c2 = box->toCol(cc);

        int x = colData.at(box->col).pos;
        int y = rData.at(box->row).pos;
        int x2p = colData.at(c2).pos + colData.at(c2).size; // x2+1
        int y2p = rData.at(r2).pos + rData.at(r2).size;    // y2+1
        int w = x2p - x;
        int h = y2p - y;

        if (visualHReversed)
            x = r.left() + r.right() - x - w + 1;
        if (vReversed)
            y = r.top() + r.bottom() - y - h + 1;

        box->setGeometry(QRect(x, y, w, h));
    }
}